

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBSubtractRow_C(uint8 *src_argb0,uint8 *src_argb1,uint8 *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int32 iVar7;
  int a_sub;
  int r_sub;
  int g_sub;
  int b_sub;
  int a;
  int r;
  int g;
  int b;
  int i;
  int width_local;
  uint8 *dst_argb_local;
  uint8 *src_argb1_local;
  uint8 *src_argb0_local;
  
  _i = dst_argb;
  dst_argb_local = src_argb1;
  src_argb1_local = src_argb0;
  for (g = 0; g < width; g = g + 1) {
    bVar1 = src_argb1_local[1];
    bVar2 = src_argb1_local[2];
    bVar3 = src_argb1_local[3];
    bVar4 = dst_argb_local[1];
    bVar5 = dst_argb_local[2];
    bVar6 = dst_argb_local[3];
    iVar7 = libyuv::clamp0((uint)*src_argb1_local - (uint)*dst_argb_local);
    *_i = (uint8)iVar7;
    iVar7 = libyuv::clamp0((uint)bVar1 - (uint)bVar4);
    _i[1] = (uint8)iVar7;
    iVar7 = libyuv::clamp0((uint)bVar2 - (uint)bVar5);
    _i[2] = (uint8)iVar7;
    iVar7 = libyuv::clamp0((uint)bVar3 - (uint)bVar6);
    _i[3] = (uint8)iVar7;
    src_argb1_local = src_argb1_local + 4;
    dst_argb_local = dst_argb_local + 4;
    _i = _i + 4;
  }
  return;
}

Assistant:

void ARGBSubtractRow_C(const uint8* src_argb0,
                       const uint8* src_argb1,
                       uint8* dst_argb,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const int b = src_argb0[0];
    const int g = src_argb0[1];
    const int r = src_argb0[2];
    const int a = src_argb0[3];
    const int b_sub = src_argb1[0];
    const int g_sub = src_argb1[1];
    const int r_sub = src_argb1[2];
    const int a_sub = src_argb1[3];
    dst_argb[0] = SHADE(b, b_sub);
    dst_argb[1] = SHADE(g, g_sub);
    dst_argb[2] = SHADE(r, r_sub);
    dst_argb[3] = SHADE(a, a_sub);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}